

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

Graph * Omega_h::edges_across_tets(Graph *__return_storage_ptr__,Adj *r2e,Adj *e2r)

{
  char *file;
  Write<int> local_240;
  Read<int> local_230;
  Read<int> local_220;
  Adj local_210;
  undefined1 local_1e0 [8];
  type f;
  string local_188 [32];
  undefined1 local_168 [8];
  Write<int> ee2e;
  LOs e2ee;
  undefined1 local_140 [4];
  int ne;
  Read<signed_char> e2er_codes;
  LOs er2r;
  LOs e2er;
  LOs re2e;
  allocator local_c9;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [39];
  ScopedTimer local_61;
  Adj *pAStack_60;
  ScopedTimer omega_h_scoped_function_timer;
  Adj *e2r_local;
  Adj *r2e_local;
  ulong local_20;
  ulong local_10;
  
  pAStack_60 = e2r;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_c9);
  std::operator+(local_a8,(char *)local_c8);
  std::__cxx11::to_string((__cxx11 *)&re2e.write_.shared_alloc_.direct_ptr,0x235);
  std::operator+(local_88,local_a8);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_61,"edges_across_tets",file);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&re2e.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  Read<int>::Read((Read<int> *)&e2er.write_.shared_alloc_.direct_ptr,&(r2e->super_Graph).ab2b);
  Read<int>::Read((Read<int> *)&er2r.write_.shared_alloc_.direct_ptr,(Read<int> *)e2r);
  Read<int>::Read((Read<int> *)&e2er_codes.write_.shared_alloc_.direct_ptr,&(e2r->super_Graph).ab2b)
  ;
  Read<signed_char>::Read((Read<signed_char> *)local_140,&e2r->codes);
  if (((ulong)er2r.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_10 = *er2r.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_10 = (ulong)er2r.write_.shared_alloc_.direct_ptr >> 3;
  }
  Read<int>::Read((Read<int> *)&ee2e.shared_alloc_.direct_ptr,
                  (Read<int> *)&er2r.write_.shared_alloc_.direct_ptr);
  if (((ulong)e2er_codes.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_20 = *e2er_codes.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_20 = (ulong)e2er_codes.write_.shared_alloc_.direct_ptr >> 3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_188,"edge edges to edges",
             (allocator *)((long)&f.ee2e.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_168,(LO)(local_20 >> 2),(string *)local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.ee2e.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_1e0,(Read<int> *)&er2r.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.e2er.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2er_codes.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.er2r.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_140);
  Read<int>::Read((Read<int> *)&f.e2er_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2er.write_.shared_alloc_.direct_ptr);
  Write<int>::Write((Write<int> *)&f.re2e.write_.shared_alloc_.direct_ptr,(Write<int> *)local_168);
  parallel_for<Omega_h::edges_across_tets(Omega_h::Adj,Omega_h::Adj)::__0>
            ((int)(local_10 >> 2) + -1,(type *)local_1e0);
  Read<int>::Read(&local_220,(Read<int> *)&ee2e.shared_alloc_.direct_ptr);
  Write<int>::Write(&local_240,(Write<int> *)local_168);
  Read<int>::Read(&local_230,&local_240);
  Adj::Adj(&local_210,&local_220,&local_230);
  Graph::Graph(__return_storage_ptr__,&local_210.super_Graph);
  Adj::~Adj(&local_210);
  Read<int>::~Read(&local_230);
  Write<int>::~Write(&local_240);
  Read<int>::~Read(&local_220);
  edges_across_tets(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)local_1e0);
  Write<int>::~Write((Write<int> *)local_168);
  Read<int>::~Read((Read<int> *)&ee2e.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)local_140);
  Read<int>::~Read((Read<int> *)&e2er_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&er2r.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&e2er.write_.shared_alloc_.direct_ptr);
  ScopedTimer::~ScopedTimer(&local_61);
  return __return_storage_ptr__;
}

Assistant:

Graph edges_across_tets(Adj const r2e, Adj const e2r) {
  OMEGA_H_TIME_FUNCTION;
  auto const re2e = r2e.ab2b;
  auto const e2er = e2r.a2ab;
  auto const er2r = e2r.ab2b;
  auto const e2er_codes = e2r.codes;
  auto const ne = e2er.size() - 1;
  auto const e2ee = e2er;
  Write<LO> ee2e(er2r.size(), "edge edges to edges");
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto const er_begin = e2er[e];
    auto const er_end = e2er[e + 1];
    for (auto er = er_begin; er < er_end; ++er) {
      auto const r = er2r[er];
      auto const e2er_code = e2er_codes[er];
      auto const rre = code_which_down(e2er_code);
      auto const rre_opp = simplex_opposite_template(REGION, EDGE, rre);
      auto const re_begin = r * 6;
      auto const e_opp = re2e[re_begin + rre_opp];
      auto const ee = er;
      ee2e[ee] = e_opp;
    }
  };
  parallel_for(ne, std::move(f));
  return Adj(e2ee, ee2e);
}